

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

void __thiscall SQTable::AllocNodes(SQTable *this,SQInteger nSize)

{
  _HashNode *i;
  _HashNode *p_Var1;
  SQUnsignedInteger size;
  uint uVar2;
  
  size = nSize * 0x28;
  p_Var1 = (_HashNode *)sq_vm_malloc(this->_alloc_ctx,size);
  uVar2 = (int)nSize - 1;
  this->_numofnodes_minus_one = uVar2;
  this->_nodes = p_Var1;
  this->_firstfree = p_Var1 + uVar2;
  for (; size != 0; size = size - 0x28) {
    (p_Var1->val).super_SQObject._type = 0;
    (p_Var1->val).super_SQObject._flags = '\0';
    *(undefined3 *)&(p_Var1->val).super_SQObject.field_0x5 = 0;
    (p_Var1->val).super_SQObject._unVal.pTable = (SQTable *)0x0;
    (p_Var1->val).super_SQObject._type = OT_NULL;
    (p_Var1->key).super_SQObject._type = 0;
    (p_Var1->key).super_SQObject._flags = '\0';
    *(undefined3 *)&(p_Var1->key).super_SQObject.field_0x5 = 0;
    (p_Var1->key).super_SQObject._unVal.pTable = (SQTable *)0x0;
    (p_Var1->key).super_SQObject._type = OT_NULL;
    p_Var1->next = (_HashNode *)0x0;
    p_Var1 = p_Var1 + 1;
  }
  return;
}

Assistant:

void SQTable::AllocNodes(SQInteger nSize)
{
    assert((nSize & (nSize-1)) == 0); // pow2
    _HashNode *nodes=(_HashNode *)SQ_MALLOC(_alloc_ctx, sizeof(_HashNode)*nSize);
    _numofnodes_minus_one=(uint32_t)(nSize-1);
    _nodes=nodes;
    _firstfree=&_nodes[_numofnodes_minus_one];
    for (_HashNode *i = nodes, *e = i + nSize; i != e; i++)
        new (i) _HashNode;
}